

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int StoreImageToBitMask(VP8LBitWriter *bw,int width,int histo_bits,VP8LBackwardRefs *refs,
                       uint32_t *histogram_symbols,HuffmanTreeCode *huffman_codes,WebPPicture *pic)

{
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  byte bVar4;
  PixOrCopy *pPVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint16_t **ppuVar16;
  HuffmanTreeCode *pHVar17;
  uint uVar18;
  uint uVar19;
  VP8LRefsCursor c;
  uint local_88;
  uint local_84;
  VP8LRefsCursor local_48;
  
  bVar4 = (byte)histo_bits;
  uVar13 = (width + (1 << (bVar4 & 0x1f))) - 1U >> (bVar4 & 0x1f);
  uVar15 = -1 << (bVar4 & 0x1f);
  if (histo_bits == 0) {
    uVar13 = 1;
    uVar15 = 0;
  }
  uVar11 = *histogram_symbols;
  VP8LRefsCursorInit(&local_48,refs);
  if (local_48.cur_pos != (PixOrCopy *)0x0) {
    pHVar17 = huffman_codes + (ulong)(uVar11 >> 8 & 0xffff) * 5;
    uVar11 = 0;
    uVar18 = 0;
    local_84 = 0;
    local_88 = 0;
    do {
      pPVar5 = local_48.cur_pos;
      if ((local_84 != (uVar11 & uVar15)) || (local_88 != (uVar18 & uVar15))) {
        pHVar17 = huffman_codes +
                  (ulong)*(ushort *)
                          ((long)histogram_symbols +
                          (long)(int)(((int)uVar11 >> (bVar4 & 0x1f)) +
                                     ((int)uVar18 >> (bVar4 & 0x1f)) * uVar13) * 4 + 1) * 5;
        local_88 = uVar18 & uVar15;
        local_84 = uVar11 & uVar15;
      }
      if ((local_48.cur_pos)->mode == '\x01') {
        uVar6 = (uint)pHVar17->code_lengths[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118]
        ;
        if (pHVar17->code_lengths[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118] != 0) {
          uVar2 = pHVar17->codes[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118];
          iVar8 = bw->used;
          if (0x1f < iVar8) {
            VP8LPutBitsFlushBits(bw);
            iVar8 = bw->used;
          }
          bw->bits = bw->bits | (ulong)uVar2 << ((byte)iVar8 & 0x3f);
LAB_0013f6ec:
          bw->used = uVar6 + iVar8;
        }
      }
      else if ((local_48.cur_pos)->mode == '\0') {
        ppuVar16 = &pHVar17->codes;
        lVar12 = 0;
        do {
          uVar6 = pPVar5->argb_or_distance >> (("\x01\x02"[lVar12] & 3) << 3) & 0xff;
          bVar1 = *(byte *)((long)ppuVar16[-1] + (ulong)uVar6);
          if (bVar1 != 0) {
            uVar2 = (*ppuVar16)[uVar6];
            iVar8 = bw->used;
            if (0x1f < iVar8) {
              VP8LPutBitsFlushBits(bw);
              iVar8 = bw->used;
            }
            bw->bits = bw->bits | (ulong)uVar2 << ((byte)iVar8 & 0x3f);
            bw->used = (uint)bVar1 + iVar8;
          }
          lVar12 = lVar12 + 1;
          ppuVar16 = ppuVar16 + 3;
        } while (lVar12 != 4);
      }
      else {
        uVar10 = (ulong)(local_48.cur_pos)->len;
        if (uVar10 < 0x200) {
          uVar6 = (uint)kPrefixEncodeCode[uVar10].code;
          uVar19 = (uint)kPrefixEncodeCode[uVar10].extra_bits;
          uVar14 = (uint)""[uVar10];
        }
        else {
          uVar7 = (local_48.cur_pos)->len - 1;
          uVar6 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar19 = 0x1e - (uVar6 ^ 0x1f);
          uVar14 = ~(-1 << ((byte)uVar19 & 0x1f)) & uVar7;
          uVar6 = (uint)((uVar7 >> (uVar19 & 0x1f) & 1) != 0) + (uVar6 ^ 0x1f) * 2 ^ 0x3e;
        }
        uVar3 = (local_48.cur_pos)->argb_or_distance;
        bVar1 = pHVar17->code_lengths[uVar6 + 0x100];
        iVar8 = uVar19 + bVar1;
        if (iVar8 != 0 && SCARRY4(uVar19,(uint)bVar1) == iVar8 < 0) {
          uVar2 = pHVar17->codes[uVar6 + 0x100];
          iVar9 = bw->used;
          if (0x1f < iVar9) {
            VP8LPutBitsFlushBits(bw);
            iVar9 = bw->used;
          }
          bw->bits = bw->bits |
                     (ulong)(uVar14 << (bVar1 & 0x1f) | (uint)uVar2) << ((byte)iVar9 & 0x3f);
          bw->used = iVar8 + iVar9;
        }
        if ((int)uVar3 < 0x200) {
          uVar7 = (uint)kPrefixEncodeCode[(int)uVar3].code;
          uVar6 = (uint)kPrefixEncodeCode[(int)uVar3].extra_bits;
          uVar10 = (ulong)""[(int)uVar3];
        }
        else {
          uVar14 = uVar3 - 1;
          uVar7 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar6 = 0x1e - (uVar7 ^ 0x1f);
          uVar10 = (ulong)(~(-1 << ((byte)uVar6 & 0x1f)) & uVar14);
          uVar7 = (uint)((uVar14 >> (uVar6 & 0x1f) & 1) != 0) + (uVar7 ^ 0x1f) * 2 ^ 0x3e;
        }
        bVar1 = pHVar17[4].code_lengths[(int)uVar7];
        if (bVar1 != 0) {
          uVar2 = pHVar17[4].codes[(int)uVar7];
          iVar8 = bw->used;
          if (0x1f < iVar8) {
            VP8LPutBitsFlushBits(bw);
            iVar8 = bw->used;
          }
          bw->bits = bw->bits | (ulong)uVar2 << ((byte)iVar8 & 0x3f);
          bw->used = (uint)bVar1 + iVar8;
        }
        if (0 < (int)uVar6) {
          iVar8 = bw->used;
          if (0x1f < iVar8) {
            VP8LPutBitsFlushBits(bw);
            iVar8 = bw->used;
          }
          bw->bits = bw->bits | uVar10 << ((byte)iVar8 & 0x3f);
          goto LAB_0013f6ec;
        }
      }
      for (uVar11 = uVar11 + pPVar5->len; width <= (int)uVar11; uVar11 = uVar11 - width) {
        uVar18 = uVar18 + 1;
      }
      local_48.cur_pos = local_48.cur_pos + 1;
      if (local_48.cur_pos == local_48.last_pos) {
        VP8LRefsCursorNextBlock(&local_48);
      }
    } while (local_48.cur_pos != (PixOrCopy *)0x0);
  }
  iVar8 = 1;
  if (bw->error != 0) {
    iVar8 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return iVar8;
}

Assistant:

static int StoreImageToBitMask(VP8LBitWriter* const bw, int width,
                               int histo_bits,
                               const VP8LBackwardRefs* const refs,
                               const uint32_t* histogram_symbols,
                               const HuffmanTreeCode* const huffman_codes,
                               const WebPPicture* const pic) {
  const int histo_xsize = histo_bits ? VP8LSubSampleSize(width, histo_bits) : 1;
  const int tile_mask = (histo_bits == 0) ? 0 : -(1 << histo_bits);
  // x and y trace the position in the image.
  int x = 0;
  int y = 0;
  int tile_x = x & tile_mask;
  int tile_y = y & tile_mask;
  int histogram_ix = (histogram_symbols[0] >> 8) & 0xffff;
  const HuffmanTreeCode* codes = huffman_codes + 5 * histogram_ix;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if ((tile_x != (x & tile_mask)) || (tile_y != (y & tile_mask))) {
      tile_x = x & tile_mask;
      tile_y = y & tile_mask;
      histogram_ix = (histogram_symbols[(y >> histo_bits) * histo_xsize +
                                        (x >> histo_bits)] >>
                      8) &
                     0xffff;
      codes = huffman_codes + 5 * histogram_ix;
    }
    if (PixOrCopyIsLiteral(v)) {
      static const uint8_t order[] = { 1, 2, 0, 3 };
      int k;
      for (k = 0; k < 4; ++k) {
        const int code = PixOrCopyLiteral(v, order[k]);
        WriteHuffmanCode(bw, codes + k, code);
      }
    } else if (PixOrCopyIsCacheIdx(v)) {
      const int code = PixOrCopyCacheIdx(v);
      const int literal_ix = 256 + NUM_LENGTH_CODES + code;
      WriteHuffmanCode(bw, codes, literal_ix);
    } else {
      int bits, n_bits;
      int code;

      const int distance = PixOrCopyDistance(v);
      VP8LPrefixEncode(v->len, &code, &n_bits, &bits);
      WriteHuffmanCodeWithExtraBits(bw, codes, 256 + code, bits, n_bits);

      // Don't write the distance with the extra bits code since
      // the distance can be up to 18 bits of extra bits, and the prefix
      // 15 bits, totaling to 33, and our PutBits only supports up to 32 bits.
      VP8LPrefixEncode(distance, &code, &n_bits, &bits);
      WriteHuffmanCode(bw, codes + 4, code);
      VP8LPutBits(bw, bits, n_bits);
    }
    x += PixOrCopyLength(v);
    while (x >= width) {
      x -= width;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
  if (bw->error) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return 1;
}